

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O0

void __thiscall
iDynTree::DiscreteKalmanFilterHelper::DiscreteKalmanFilterHelper(DiscreteKalmanFilterHelper *this)

{
  long in_RDI;
  
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x18));
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x38));
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x58));
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x78));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x98));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0xc0));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0xe8));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x110));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x138));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x160));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x188));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x1b0));
  *(undefined1 *)(in_RDI + 0x1d8) = 0;
  *(undefined1 *)(in_RDI + 0x1d9) = 0;
  *(undefined1 *)(in_RDI + 0x1da) = 0;
  *(undefined1 *)(in_RDI + 0x1db) = 0;
  *(undefined1 *)(in_RDI + 0x1dc) = 0;
  *(undefined1 *)(in_RDI + 0x1dd) = 0;
  *(undefined1 *)(in_RDI + 0x1de) = 0;
  *(undefined1 *)(in_RDI + 0x1df) = 0;
  *(undefined1 *)(in_RDI + 0x1e0) = 0;
  *(undefined1 *)(in_RDI + 0x1e1) = 0;
  return;
}

Assistant:

iDynTree::DiscreteKalmanFilterHelper::DiscreteKalmanFilterHelper()
{

}